

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS1.cpp
# Opt level: O0

bool __thiscall RTIMULSM9DS1::setGyroSampleRate(RTIMULSM9DS1 *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  byte local_19;
  uchar ctrl1;
  RTIMULSM9DS1 *this_local;
  
  switch(((this->super_RTIMU).m_settings)->m_LSM9DS1GyroSampleRate) {
  case 0:
    local_19 = 0x20;
    (this->super_RTIMU).m_sampleRate = 0xf;
    break;
  case 1:
    local_19 = 0x40;
    (this->super_RTIMU).m_sampleRate = 0x3c;
    break;
  case 2:
    local_19 = 0x60;
    (this->super_RTIMU).m_sampleRate = 0x77;
    break;
  case 3:
    local_19 = 0x80;
    (this->super_RTIMU).m_sampleRate = 0xee;
    break;
  case 4:
    local_19 = 0xa0;
    (this->super_RTIMU).m_sampleRate = 0x1dc;
    break;
  case 5:
    local_19 = 0xc0;
    (this->super_RTIMU).m_sampleRate = 0x3b8;
    break;
  default:
    fprintf(_stderr,"Illegal LSM9DS1 gyro sample rate code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_LSM9DS1GyroSampleRate);
    return false;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(this->super_RTIMU).m_sampleRate;
  (this->super_RTIMU).m_sampleInterval = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000000)) / auVar2,0);
  switch(((this->super_RTIMU).m_settings)->m_LSM9DS1GyroBW) {
  case 0:
    break;
  case 1:
    local_19 = local_19 | 1;
    break;
  case 2:
    local_19 = local_19 | 2;
    break;
  case 3:
    local_19 = local_19 | 3;
  }
  iVar1 = ((this->super_RTIMU).m_settings)->m_LSM9DS1GyroFsr;
  if (iVar1 == 0) {
    this->m_gyroScale = 0.00015271631;
  }
  else if (iVar1 == 1) {
    local_19 = local_19 | 8;
    this->m_gyroScale = 0.00030543262;
  }
  else {
    if (iVar1 != 3) {
      fprintf(_stderr,"Illegal LSM9DS1 gyro FSR code %d\n",
              (ulong)(uint)((this->super_RTIMU).m_settings)->m_LSM9DS1GyroFsr);
      return false;
    }
    local_19 = local_19 | 0x18;
    this->m_gyroScale = 0.0012217305;
  }
  bVar3 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                             this->m_accelGyroSlaveAddr,'\x10',local_19,
                             "Failed to set LSM9DS1 gyro CTRL1");
  return bVar3;
}

Assistant:

bool RTIMULSM9DS1::setGyroSampleRate()
{
    unsigned char ctrl1;

    switch (m_settings->m_LSM9DS1GyroSampleRate) {
    case LSM9DS1_GYRO_SAMPLERATE_14_9:
        ctrl1 = 0x20;
        m_sampleRate = 15;
        break;

    case LSM9DS1_GYRO_SAMPLERATE_59_5:
        ctrl1 = 0x40;
        m_sampleRate = 60;
        break;

    case LSM9DS1_GYRO_SAMPLERATE_119:
        ctrl1 = 0x60;
        m_sampleRate = 119;
        break;

    case LSM9DS1_GYRO_SAMPLERATE_238:
        ctrl1 = 0x80;
        m_sampleRate = 238;
        break;

    case LSM9DS1_GYRO_SAMPLERATE_476:
        ctrl1 = 0xa0;
        m_sampleRate = 476;
        break;

    case LSM9DS1_GYRO_SAMPLERATE_952:
        ctrl1 = 0xc0;
        m_sampleRate = 952;
        break;

    default:
        HAL_ERROR1("Illegal LSM9DS1 gyro sample rate code %d\n", m_settings->m_LSM9DS1GyroSampleRate);
        return false;
    }

    m_sampleInterval = (uint64_t)1000000 / m_sampleRate;

    switch (m_settings->m_LSM9DS1GyroBW) {
    case LSM9DS1_GYRO_BANDWIDTH_0:
        ctrl1 |= 0x00;
        break;

    case LSM9DS1_GYRO_BANDWIDTH_1:
        ctrl1 |= 0x01;
        break;

    case LSM9DS1_GYRO_BANDWIDTH_2:
        ctrl1 |= 0x02;
        break;

    case LSM9DS1_GYRO_BANDWIDTH_3:
        ctrl1 |= 0x03;
        break;
    }

    switch (m_settings->m_LSM9DS1GyroFsr) {
    case LSM9DS1_GYRO_FSR_250:
        ctrl1 |= 0x00;
        m_gyroScale = (RTFLOAT)0.00875 * RTMATH_DEGREE_TO_RAD;
        break;

    case LSM9DS1_GYRO_FSR_500:
        ctrl1 |= 0x08;
        m_gyroScale = (RTFLOAT)0.0175 * RTMATH_DEGREE_TO_RAD;
        break;

    case LSM9DS1_GYRO_FSR_2000:
        ctrl1 |= 0x18;
        m_gyroScale = (RTFLOAT)0.07 * RTMATH_DEGREE_TO_RAD;
        break;

    default:
        HAL_ERROR1("Illegal LSM9DS1 gyro FSR code %d\n", m_settings->m_LSM9DS1GyroFsr);
        return false;
    }
    return (m_settings->HALWrite(m_accelGyroSlaveAddr, LSM9DS1_CTRL1, ctrl1, "Failed to set LSM9DS1 gyro CTRL1"));
}